

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O0

int __thiscall Qentem::QTest::EndTests(QTest *this)

{
  bool bVar1;
  char *local_30;
  char *local_28;
  char *local_20;
  QTest *local_18;
  QTest *this_local;
  
  bVar1 = (this->error_ & 1U) != 0;
  if (!bVar1) {
    local_18 = this;
    local_20 = TestOutPut::GetColor(TITLE);
    local_28 = TestOutPut::GetColor(PASS);
    local_30 = TestOutPut::GetColor(END);
    TestOutPut::Print<char_const*,char_const*,char_const*,char[18],char_const*,char[3]>
              (&local_20,&this->test_name_,&local_28,(char (*) [18])" Passed all tests",&local_30,
               (char (*) [3])0x1085ac);
  }
  this_local._4_4_ = (uint)bVar1;
  return this_local._4_4_;
}

Assistant:

QENTEM_NOINLINE int EndTests() {
        if (!error_) {
            TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::TITLE), test_name_,
                              TestOutPut::GetColor(TestOutPut::Colors::PASS), " Passed all tests",
                              TestOutPut::GetColor(TestOutPut::Colors::END), "\n\n");
            return 0;
        }

        return 1;
    }